

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_lexer.c
# Opt level: O2

gtoken_t lexer_scan_number(gravity_lexer_t *lexer)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  bool bVar12;
  bool bVar13;
  _Bool _Var14;
  bool bVar15;
  int iVar16;
  int iVar17;
  char *pcVar18;
  bool bVar19;
  gravity_number_type ntype;
  ulong uVar20;
  
  pcVar18 = lexer->buffer;
  uVar8 = lexer->offset;
  uVar20 = (ulong)uVar8;
  if (pcVar18[uVar20] == '0') {
    uVar9 = lexer->length;
    iVar16 = 0;
    if (uVar8 < uVar9) {
      iVar16 = (int)pcVar18[uVar20 + 1];
    }
    iVar16 = toupper(iVar16);
    iVar17 = 0;
    if (iVar16 == 0x58) {
      ntype = NUMBER_HEX;
    }
    else {
      if (uVar8 < uVar9) {
        iVar17 = (int)pcVar18[uVar20 + 1];
      }
      iVar16 = toupper(iVar17);
      iVar17 = 0;
      if (iVar16 != 0x42) {
        if (uVar8 < uVar9) {
          iVar17 = (int)pcVar18[uVar20 + 1];
        }
        iVar16 = toupper(iVar17);
        bVar12 = iVar16 != 0x4f;
        ntype = (uint)(iVar16 == 0x4f) * 3;
        goto LAB_0013bcc1;
      }
      ntype = NUMBER_BIN;
    }
    bVar12 = false;
  }
  else {
    ntype = NUMBER_INTEGER;
    bVar12 = true;
  }
LAB_0013bcc1:
  (lexer->token).type = TOK_EOF;
  (lexer->token).lineno = 0;
  (lexer->token).colno = 0;
  (lexer->token).position = 0;
  (lexer->token).bytes = 0;
  (lexer->token).length = 0;
  (lexer->token).fileid = 0;
  (lexer->token).builtin = BUILTIN_NONE;
  uVar10 = lexer->position;
  uVar11 = lexer->lineno;
  (lexer->token).position = uVar10;
  (lexer->token).value = pcVar18 + uVar20;
  (lexer->token).lineno = uVar11;
  uVar11 = lexer->colno;
  (lexer->token).colno = uVar11;
  if (!bVar12) {
    uVar1 = (lexer->token).bytes;
    uVar4 = (lexer->token).length;
    (lexer->token).bytes = uVar1 + 2;
    (lexer->token).length = uVar4 + 2;
    uVar20 = (ulong)(uVar8 + 2);
    lexer->offset = uVar8 + 2;
    lexer->colno = uVar11 + 2;
    lexer->position = uVar10 + 2;
  }
  bVar13 = false;
  bVar15 = false;
  bVar19 = false;
  do {
    if (lexer->length <= (uint)uVar20) {
LAB_0013be2f:
      (lexer->token).type = TOK_NUMBER;
      (lexer->token).fileid = lexer->fileid;
      return TOK_NUMBER;
    }
    bVar7 = pcVar18[uVar20];
    iVar16 = (int)(char)bVar7;
    _Var14 = is_digit(iVar16,ntype);
    if (!_Var14) {
      if (((bVar7 < 0x21) && ((0x100001a00U >> ((ulong)(uint)bVar7 & 0x3f) & 1) != 0)) ||
         (_Var14 = is_newline(lexer,iVar16), _Var14)) goto LAB_0013be2f;
      if ((bool)(bVar7 == 0x65 & bVar12)) {
        if (!bVar15) {
          bVar15 = true;
          bVar19 = true;
          goto LAB_0013bdec;
        }
      }
      else if ((bool)(bVar7 == 0x2e & bVar12)) {
        iVar17 = 0;
        if (lexer->offset < lexer->length) {
          iVar17 = (int)lexer->buffer[(ulong)lexer->offset + 1];
        }
        _Var14 = is_digit(iVar17,ntype);
        if (!_Var14) goto LAB_0013be2f;
        if (!bVar13) {
          bVar13 = true;
          goto LAB_0013bdec;
        }
      }
      if ((!bVar19) || ((bVar19 = false, bVar7 != 0x2b && (bVar7 != 0x2d)))) {
        _Var14 = is_builtin_operator(iVar16);
        if (bVar7 != 0x3b && !_Var14) {
          lexer_error(lexer,"Malformed number expression.");
          return TOK_ERROR;
        }
        goto LAB_0013be2f;
      }
    }
LAB_0013bdec:
    uVar2 = (lexer->token).bytes;
    uVar5 = (lexer->token).length;
    (lexer->token).bytes = uVar2 + 1;
    (lexer->token).length = uVar5 + 1;
    lexer->colno = lexer->colno + 1;
    uVar3 = lexer->offset;
    uVar6 = lexer->position;
    lexer->offset = uVar3 + 1;
    lexer->position = uVar6 + 1;
    pcVar18 = lexer->buffer;
    uVar20 = (ulong)(uVar3 + 1);
  } while( true );
}

Assistant:

static gtoken_t lexer_scan_number(gravity_lexer_t *lexer) {
    bool        floatAllowed = true;
    bool        expAllowed = true;
    bool        signAllowed = false;
    bool        dotFound = false;
    bool        expFound = false;
    int            c, expChar = 'e', floatChar = '.';
    int            plusSign = '+', minusSign = '-';

    gravity_number_type    ntype = NUMBER_INTEGER;
    if (PEEK_CURRENT == '0') {
        if (toupper(PEEK_NEXT) == 'X') {ntype = NUMBER_HEX; floatAllowed = false; expAllowed = false;}
        else if (toupper(PEEK_NEXT) == 'B') {ntype = NUMBER_BIN; floatAllowed = false; expAllowed = false;}
        else if (toupper(PEEK_NEXT) == 'O') {ntype = NUMBER_OCT; floatAllowed = false; expAllowed = false;}
    }

    TOKEN_RESET;
    if (ntype != NUMBER_INTEGER) {
        // skip first 0* number marker
        INC_TOKLEN;
        INC_TOKLEN;
        INC_OFFSET_POSITION;
        INC_OFFSET_POSITION;
    }

    // supported exp formats:
    // 12345    // decimal
    // 3.1415    // float
    // 1.25e2 = 1.25 * 10^2 = 125.0        // scientific notation
    // 1.25e-2 = 1.25 * 10^-2 = 0.0125    // scientific notation
    // 0xFFFF    // hex
    // 0B0101    // binary
    // 0O7777    // octal

loop:
    c = PEEK_CURRENT;

    // explicitly list all accepted cases
    if (IS_EOF) goto report_token;
    if (is_digit(c, ntype)) goto accept_char;
    if (is_whitespace(c)) goto report_token;
    if (is_newline(lexer, c)) goto report_token;

    if (expAllowed) {
        if ((c == expChar) && (!expFound)) {expFound = true; signAllowed = true; goto accept_char;}
    }
    if (floatAllowed) {
        if ((c == floatChar) && (!is_digit(PEEK_NEXT, ntype))) goto report_token;
        if ((c == floatChar) && (!dotFound))  {dotFound = true; goto accept_char;}
    }
    if (signAllowed) {
        if ((c == plusSign) || (c == minusSign)) {signAllowed = false; goto accept_char;}
    }
    if (is_builtin_operator(c)) goto report_token;
    if (is_semicolon(c)) goto report_token;

    // any other case is an error
    goto report_error;

accept_char:
    INC_TOKLEN;
    INC_OFFSET_POSITION;
    goto loop;

report_token:
    // number is from buffer->[nseek] and it is bytes length
    TOKEN_FINALIZE(TOK_NUMBER);

    DEBUG_LEXEM("Found number: %.*s", TOKEN_BYTES(lexer->token), TOKEN_VALUE(lexer->token));
    return TOK_NUMBER;

report_error:
    return lexer_error(lexer, "Malformed number expression.");
}